

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void nullRelation(int op,item *x)

{
  item *y;
  typeDesc *ptVar1;
  
  y = (item *)calloc(1,0x30);
  ptVar1 = getType(x->typeIndex);
  if (ptVar1->form == 0x324) {
    y->mode = 0x2c2;
    putOp(5,x,y);
    x->c = op;
    x->mode = 0x2c3;
    x->typeIndex = boolTypeIndex;
    x->a = 0;
    x->b = 0;
    return;
  }
  mark("reference required in relation");
  exit(-1);
}

Assistant:

procedure
void nullRelation(int op, struct item *x) {
	variable struct item *y;
	variable struct typeDesc *type;
	type = NULL; y = NULL;
	allocMem(y);
	type = getType(x->typeIndex);
	if (type->form != FORM_REF) {
		mark("reference required in relation");
		exit(-1);
	}
	y->mode = CLASS_REG; y->r = 0;
	putOp(RISC_CMP,x,y);
	x->c = op; x->mode = CLASS_COND; x->typeIndex = boolTypeIndex; x->a=0; x->b=0;
}